

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

QObjectList * __thiscall
QObjectPrivate::receiverList(QObjectList *__return_storage_ptr__,QObjectPrivate *this,char *signal)

{
  __pointer_type pCVar1;
  long lVar2;
  QObject *pQVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QObject *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QObject **)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar4 = signalIndex(this,signal,(QMetaObject **)0x0);
  pCVar1 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if (((-1 < (int)uVar4 && pCVar1 != (__pointer_type)0x0) &&
      ((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b.
       _M_p != (__pointer_type)0x0)) &&
     ((int)uVar4 <
      (int)((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
            _M_b._M_p)->allocated)) {
    pQVar3 = local_28;
    for (lVar2 = *(long *)&(pCVar1->signalVector).
                           super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b.
                           _M_p[(ulong)uVar4 + 2].super_ConnectionOrSignalVector; local_28 = pQVar3,
        lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x10)) {
      local_28 = *(QObject **)(lVar2 + 0x28);
      if (local_28 != (QObject *)0x0) {
        QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
                  ((QPodArrayOps<QObject*> *)__return_storage_ptr__,(__return_storage_ptr__->d).size
                   ,&local_28);
        QList<QObject_*>::end(__return_storage_ptr__);
        pQVar3 = local_28;
      }
      local_28 = pQVar3;
      pQVar3 = local_28;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QObjectList QObjectPrivate::receiverList(const char *signal) const
{
    QObjectList returnValue;
    int signal_index = signalIndex(signal);
    ConnectionData *cd = connections.loadAcquire();
    if (signal_index < 0 || !cd)
        return returnValue;
    if (signal_index < cd->signalVectorCount()) {
        const QObjectPrivate::Connection *c = cd->signalVector.loadRelaxed()->at(signal_index).first.loadRelaxed();

        while (c) {
            QObject *r = c->receiver.loadRelaxed();
            if (r)
                returnValue << r;
            c = c->nextConnectionList.loadRelaxed();
        }
    }
    return returnValue;
}